

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::comparatorInstruction
          (SelectionEvaluator *this,Token *instruction,int frame)

{
  int *in_RDX;
  SelectionEvaluator *in_RDI;
  int in_stack_00000020;
  float in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  SelectionSet *in_stack_00000030;
  Molecule *in_stack_00000038;
  int in_stack_00000040;
  float in_stack_00000044;
  int in_stack_00000048;
  int in_stack_0000004c;
  SelectionSet *in_stack_00000050;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  Atom *atom;
  AtomIterator ai;
  Molecule *mol;
  MoleculeIterator mi;
  SelectionSet bs;
  float comparisonValue;
  int property;
  int comparator;
  any *in_stack_ffffffffffffff30;
  Atom *in_stack_ffffffffffffff48;
  SimInfo *this_00;
  SelectionSet *this_01;
  RigidBody *local_80;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_78;
  Atom *local_70;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_68;
  Molecule *local_60;
  undefined1 local_58 [48];
  float local_28;
  int local_24;
  int local_20;
  
  local_20 = *in_RDX;
  local_24 = in_RDX[1];
  local_28 = std::any_cast<float>(in_stack_ffffffffffffff30);
  this_01 = (SelectionSet *)(local_58 + 0x18);
  createSelectionSets(in_RDI);
  SelectionSet::clearAll((SelectionSet *)in_stack_ffffffffffffff30);
  this_00 = (SimInfo *)local_58;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_78);
  local_60 = SimInfo::beginMolecule(this_00,(MoleculeIterator *)in_stack_ffffffffffffff48);
  while (local_60 != (Molecule *)0x0) {
    compareProperty((SelectionEvaluator *)CONCAT44(in_stack_00000044,in_stack_00000040),
                    in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                    in_stack_00000024,in_stack_00000020);
    in_stack_ffffffffffffff48 =
         Molecule::beginAtom((Molecule *)this_00,(iterator *)in_stack_ffffffffffffff48);
    local_70 = in_stack_ffffffffffffff48;
    while (local_70 != (Atom *)0x0) {
      compareProperty((SelectionEvaluator *)rbIter._M_current,&rb->super_StuntDouble,
                      in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                      in_stack_00000040);
      local_70 = Molecule::nextAtom((Molecule *)this_00,(iterator *)in_stack_ffffffffffffff48);
    }
    local_80 = Molecule::beginRigidBody((Molecule *)this_00,(iterator *)in_stack_ffffffffffffff48);
    while (local_80 != (RigidBody *)0x0) {
      compareProperty((SelectionEvaluator *)rbIter._M_current,&rb->super_StuntDouble,
                      in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                      in_stack_00000040);
      local_80 = Molecule::nextRigidBody((Molecule *)this_00,(iterator *)in_stack_ffffffffffffff48);
    }
    local_60 = SimInfo::nextMolecule(this_00,(MoleculeIterator *)in_stack_ffffffffffffff48);
  }
  SelectionSet::parallelReduce(this_01);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c8416);
  return (SelectionSet *)in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::comparatorInstruction(
      const Token& instruction, int frame) {
    int comparator        = instruction.tok;
    int property          = instruction.intValue;
    float comparisonValue = std::any_cast<float>(instruction.value);
    SelectionSet bs       = createSelectionSets();
    bs.clearAll();

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      compareProperty(mol, bs, property, comparator, comparisonValue, frame);

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        compareProperty(atom, bs, property, comparator, comparisonValue, frame);
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        compareProperty(rb, bs, property, comparator, comparisonValue, frame);
      }
    }

    return bs.parallelReduce();
  }